

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O2

string * __thiscall
Centaurus::readmbsfromfile_abi_cxx11_(string *__return_storage_ptr__,Centaurus *this,char *filename)

{
  undefined8 uVar1;
  ifstream ifs;
  undefined8 auStack_130 [36];
  
  std::ifstream::ifstream(&ifs,(char *)this,_S_in);
  uVar1 = *(undefined8 *)((long)auStack_130 + *(long *)(_ifs + -0x18));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((string *)__return_storage_ptr__,uVar1,0xffffffffffffffff,0,0xffffffff);
  std::ifstream::~ifstream(&ifs);
  return __return_storage_ptr__;
}

Assistant:

std::string readmbsfromfile(const char *filename)
{
	std::ifstream ifs(filename);

	return std::string(std::istreambuf_iterator<char>(ifs), {});
}